

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O2

void proto3::TestMessage::SharedDtor(MessageLite *self)

{
  MessageType *pMVar1;
  ulong uVar2;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[0x10]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 0x11));
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[0x11]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 0x12));
    pMVar1 = (MessageType *)self[0x12]._internal_metadata_.ptr_;
    if (pMVar1 != (MessageType *)0x0) {
      MessageType::~MessageType(pMVar1);
    }
    operator_delete(pMVar1,0x20);
    pMVar1 = (MessageType *)self[0x13]._vptr_MessageLite;
    if (pMVar1 != (MessageType *)0x0) {
      MessageType::~MessageType(pMVar1);
    }
    operator_delete(pMVar1,0x20);
    Impl_::~Impl_((Impl_ *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/util/json_format_proto3.pb.cc"
             ,0xb9a,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void TestMessage::SharedDtor(MessageLite& self) {
  TestMessage& this_ = static_cast<TestMessage&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.string_value_.Destroy();
  this_._impl_.bytes_value_.Destroy();
  this_._impl_.optional_string_value_.Destroy();
  this_._impl_.optional_bytes_value_.Destroy();
  delete this_._impl_.message_value_;
  delete this_._impl_.optional_message_value_;
  this_._impl_.~Impl_();
}